

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [29],char **RestArgs,char (*RestArgs_1) [24],char **RestArgs_2,
               char (*RestArgs_3) [21],char **RestArgs_4,char (*RestArgs_5) [91])

{
  char (*RestArgs_local_3) [21];
  char **RestArgs_local_2;
  char (*RestArgs_local_1) [24];
  char **RestArgs_local;
  char (*FirstArg_local) [29];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[29]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[24],char_const*,char[21],char_const*,char[91]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}